

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv2srt.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  char *flv;
  int iVar5;
  FILE *flv_00;
  srt_t *srt;
  size_t sVar6;
  byte *pbVar7;
  char *__format;
  ulong size;
  double dVar8;
  flvtag_t tag;
  int has_video;
  int has_audio;
  caption_frame_t frame;
  mpeg_bitstream_t mpegbs;
  
  flv = argv[1];
  flvtag_init(&tag);
  caption_frame_init(&frame);
  mpeg_bitstream_init(&mpegbs);
  flv_00 = flv_open_read(flv);
  srt = srt_new();
  iVar5 = flv_read_header(flv_00,&has_audio,&has_video);
  __format = "Reading from \'%s\'\n";
  if (iVar5 == 0) {
    __format = "\'%s\' Not an flv file\n";
  }
  fprintf(_stderr,__format,flv);
  do {
    do {
      do {
        iVar5 = flv_read_tag(flv_00,&tag);
        if (iVar5 == 0) {
          srt_dump(srt);
          srt_free(srt);
          return 1;
        }
      } while ((((*tag.data & 0x1f) != 9) || ((tag.data[0xb] & 0xf) != 7)) ||
              (tag.data[0xc] != '\x01'));
      sVar6 = flvtag_payload_size(&tag);
      pbVar7 = flvtag_payload_data(&tag);
    } while ((long)sVar6 < 1);
    do {
      dVar8 = 0.0;
      if ((((*tag.data & 0x1f) == 9) && ((tag.data[0xb] & 0xf) == 7)) && (tag.data[0xc] == '\x01'))
      {
        dVar8 = (double)((uint)tag.data[0xf] |
                        (uint)tag.data[0xe] << 8 | (uint)tag.data[0xd] << 0x10);
      }
      bVar1 = *pbVar7;
      bVar2 = pbVar7[1];
      bVar3 = pbVar7[2];
      bVar4 = pbVar7[3];
      mpeg_bitstream_parse
                (&mpegbs,&frame,(uint8_t *)"",3,0x1b,
                 (double)((uint)tag.data[6] |
                         (uint)tag.data[5] << 8 |
                         (uint)tag.data[4] << 0x10 | (uint)tag.data[7] << 0x18) / 1000.0,
                 dVar8 / 1000.0);
      if (((*tag.data & 0x1f) == 9) && ((tag.data[0xb] & 0xf) == 7)) {
        dVar8 = 0.0;
        if (tag.data[0xc] == '\x01') {
          dVar8 = (double)((uint)tag.data[0xf] |
                          (uint)tag.data[0xe] << 8 | (uint)tag.data[0xd] << 0x10);
        }
      }
      else {
        dVar8 = 0.0;
      }
      size = (ulong)bVar4 |
             (ulong)bVar3 << 8 | (long)(int)((uint)bVar1 << 0x18) | (ulong)bVar2 << 0x10;
      mpeg_bitstream_parse
                (&mpegbs,&frame,pbVar7 + 4,size,0x1b,
                 (double)((uint)tag.data[6] |
                         (uint)tag.data[5] << 8 |
                         (uint)tag.data[4] << 0x10 | (uint)tag.data[7] << 0x18) / 1000.0,
                 dVar8 / 1000.0);
      if (mpegbs.status != LIBCAPTION_OK) {
        if (mpegbs.status != LIBCAPTION_READY) {
          fwrite("LIBCAPTION_ERROR == mpeg_bitstream_parse()\n",0x2b,1,_stderr);
          mpeg_bitstream_init(&mpegbs);
          return 1;
        }
        caption_frame_dump(&frame);
        vtt_cue_from_caption_frame(&frame,srt);
      }
      sVar6 = sVar6 - (size + 4);
      pbVar7 = pbVar7 + size + 4;
    } while (0 < (long)sVar6);
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
    flvtag_t tag;
    srt_t* srt = 0;
    int has_audio, has_video;
    caption_frame_t frame;
    mpeg_bitstream_t mpegbs;
    const char* path = argv[1];

    flvtag_init(&tag);
    caption_frame_init(&frame);
    mpeg_bitstream_init(&mpegbs);

    FILE* flv = flv_open_read(path);
    srt = srt_new();

    if (!flv_read_header(flv, &has_audio, &has_video)) {
        fprintf(stderr, "'%s' Not an flv file\n", path);
    } else {
        fprintf(stderr, "Reading from '%s'\n", path);
    }

    while (flv_read_tag(flv, &tag)) {
        if (flvtag_avcpackettype_nalu == flvtag_avcpackettype(&tag)) {
            ssize_t size = flvtag_payload_size(&tag);
            uint8_t* data = flvtag_payload_data(&tag);

            while (0 < size) {
                size_t nalu_size = (data[0] << 24) | (data[1] << 16) | (data[2] << 8) | data[3];
                mpeg_bitstream_parse(&mpegbs, &frame, (const uint8_t*)"\0\0\1", 3, STREAM_TYPE_H264, flvtag_dts_seconds(&tag), flvtag_cts_seconds(&tag));
                mpeg_bitstream_parse(&mpegbs, &frame, &data[LENGTH_SIZE], nalu_size, STREAM_TYPE_H264, flvtag_dts_seconds(&tag), flvtag_cts_seconds(&tag));
                data += nalu_size + LENGTH_SIZE, size -= nalu_size + LENGTH_SIZE;
                switch (mpeg_bitstream_status(&mpegbs)) {
                default:
                case LIBCAPTION_ERROR:
                    fprintf(stderr, "LIBCAPTION_ERROR == mpeg_bitstream_parse()\n");
                    mpeg_bitstream_init(&mpegbs);
                    return EXIT_FAILURE;
                    break;

                case LIBCAPTION_OK:
                    break;

                case LIBCAPTION_READY: {
                    caption_frame_dump(&frame);
                    srt_cue_from_caption_frame(&frame, srt);
                } break;
                } //switch
            }
        }
    }

    srt_dump(srt);
    srt_free(srt);

    return 1;
}